

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O0

void PatchAlterNigelColors::fix_sword_shade_frame(ROM *rom,uint32_t address,uint8_t tile_id)

{
  initializer_list<unsigned_char> __l;
  allocator<unsigned_char> local_42;
  uint8_t local_41;
  iterator local_40;
  size_type local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  uint8_t local_15;
  uint32_t local_14;
  uint8_t tile_id_local;
  ROM *pRStack_10;
  uint32_t address_local;
  ROM *rom_local;
  
  local_40 = &local_41;
  local_38 = 1;
  local_41 = tile_id;
  local_15 = tile_id;
  local_14 = address;
  pRStack_10 = rom;
  std::allocator<unsigned_char>::allocator(&local_42);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30,__l,&local_42);
  fix_sword_shade_frame(rom,address,&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  std::allocator<unsigned_char>::~allocator(&local_42);
  return;
}

Assistant:

static void fix_sword_shade_frame(md::ROM& rom, uint32_t address, const uint8_t tile_id)
    {
        fix_sword_shade_frame(rom, address, std::vector<uint8_t>({tile_id}));
    }